

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void createBackup(string *fileName,int dublicateNumber)

{
  undefined1 local_168 [8];
  path dst;
  undefined1 local_e8 [8];
  path src;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string dstPath;
  int dublicateNumber_local;
  string *fileName_local;
  
  dstPath.field_2._12_4_ = dublicateNumber;
  std::operator+(&local_78,"backups/",fileName);
  std::__cxx11::to_string(&local_98,dstPath.field_2._12_4_);
  std::operator+(&local_58,&local_78,&local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,".log");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)local_e8,fileName);
  std::experimental::filesystem::v1::__cxx11::path::
  path<char[8],std::experimental::filesystem::v1::__cxx11::path>
            ((path *)&dst._M_type,(char (*) [8])"backups");
  std::experimental::filesystem::v1::create_directory((path *)&dst._M_type);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&dst._M_type);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::experimental::filesystem::v1::copy((path *)local_e8,(path *)local_168,overwrite_existing);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_168);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_e8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void createBackup(std::string fileName, int dublicateNumber) {
    std::string dstPath = "backups/" + fileName + std::to_string(dublicateNumber) + ".log";
    const std::experimental::filesystem::path src = fileName;
    std::experimental::filesystem::create_directory("backups");
    const std::experimental::filesystem::path dst = dstPath;
    std::experimental::filesystem::copy(src, dst, std::experimental::filesystem::copy_options::overwrite_existing);
}